

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void yprp_node_common1(lys_ypr_ctx_conflict *pctx,lysp_node *node,int8_t *flag)

{
  ly_stmt substmt;
  char *elem_name;
  lysp_when *when;
  int8_t *flag_local;
  lysp_node *node_local;
  lys_ypr_ctx_conflict *pctx_local;
  
  elem_name = lys_nodetype2str(node->nodetype);
  ypr_open(pctx,elem_name,"name",node->name,*flag);
  (pctx->field_0).field_0.level = (pctx->field_0).field_0.level + 1;
  substmt = lyplg_ext_nodetype2stmt(node->nodetype);
  yprp_extension_instances(pctx,substmt,'\0',node->exts,flag);
  when = lysp_node_when(node);
  yprp_when(pctx,when,flag);
  yprp_iffeatures(pctx,node->iffeatures,node->exts,flag);
  return;
}

Assistant:

static void
yprp_node_common1(struct lys_ypr_ctx *pctx, const struct lysp_node *node, int8_t *flag)
{
    ypr_open(pctx, lys_nodetype2str(node->nodetype), "name", node->name, *flag);
    LEVEL++;

    yprp_extension_instances(pctx, lyplg_ext_nodetype2stmt(node->nodetype), 0, node->exts, flag);
    yprp_when(pctx, lysp_node_when(node), flag);
    yprp_iffeatures(pctx, node->iffeatures, node->exts, flag);
}